

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_ComputeInnerForcing
              (ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int stage,sunrealtype cdiff)

{
  int iVar1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  int *piVar4;
  MRIStepCoupling pMVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  
  psVar2 = step_mem->cvals;
  pp_Var3 = step_mem->Xvecs;
  if (0 < stage) {
    iVar7 = step_mem->explicit_rhs;
    iVar1 = step_mem->implicit_rhs;
    uVar8 = 0;
    iVar10 = 0;
    do {
      if ((iVar7 != 0) && (-1 < (long)step_mem->stage_map[uVar8])) {
        pp_Var3[iVar10] = step_mem->Fse[step_mem->stage_map[uVar8]];
        iVar10 = iVar10 + 1;
      }
      if ((iVar1 != 0) && (-1 < (long)step_mem->stage_map[uVar8])) {
        pp_Var3[iVar10] = step_mem->Fsi[step_mem->stage_map[uVar8]];
        iVar10 = iVar10 + 1;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)stage != uVar8);
  }
  lVar6 = (long)step_mem->MRIC->nmat;
  if (0 < lVar6) {
    dVar11 = 1.0 / cdiff;
    lVar9 = 0;
    do {
      iVar7 = 0;
      if (0 < stage) {
        piVar4 = step_mem->stage_map;
        uVar8 = 0;
        iVar7 = 0;
        do {
          if (-1 < piVar4[uVar8]) {
            if (step_mem->explicit_rhs == 0) {
              psVar2[iVar7] = step_mem->MRIC->G[lVar9][stage][uVar8] * dVar11;
            }
            else {
              iVar1 = step_mem->implicit_rhs;
              pMVar5 = step_mem->MRIC;
              psVar2[iVar7] = pMVar5->W[lVar9][stage][uVar8] * dVar11;
              if (iVar1 != 0) {
                psVar2[(long)iVar7 + 1] = pMVar5->G[lVar9][stage][uVar8] * dVar11;
                iVar7 = iVar7 + 2;
                goto LAB_00146dcc;
              }
            }
            iVar7 = iVar7 + 1;
          }
LAB_00146dcc:
          uVar8 = uVar8 + 1;
        } while ((uint)stage != uVar8);
      }
      iVar7 = N_VLinearCombination(iVar7,psVar2,pp_Var3);
      if (iVar7 != 0) {
        return -0x1c;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar6);
  }
  return 0;
}

Assistant:

int mriStep_ComputeInnerForcing(SUNDIALS_MAYBE_UNUSED ARKodeMem ark_mem,
                                ARKodeMRIStepMem step_mem, int stage,
                                sunrealtype cdiff)
{
  sunrealtype rcdiff;
  int j, k, nmat, nstore, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++)
  {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++)
  {
    nstore = 0;
    for (j = 0; j < stage; j++)
    {
      if (step_mem->stage_map[j] > -1)
      {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs)
        {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
        else if (step_mem->explicit_rhs)
        {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        }
        else
        {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

#ifdef SUNDIALS_LOGGING_EXTRA_DEBUG
  for (k = 0; k < nmat; k++)
  {
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_DEBUG,
                       "ARKODE::mriStep_ComputeInnerForcing", "forcing",
                       "forcing_%i(:) =", k);
    N_VPrintFile(step_mem->stepper->forcing[k], ARK_LOGGER->debug_fp);
  }
#endif

  return (ARK_SUCCESS);
}